

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O1

Value __thiscall jbcoin::STTx::getJson(STTx *this,int options,bool binary)

{
  SField **ppSVar1;
  ValueHolder VVar2;
  ushort uVar3;
  undefined4 extraout_var;
  ValueHolder *pVVar4;
  undefined4 extraout_var_00;
  int in_ECX;
  uint uVar5;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined4 in_register_00000034;
  STObject *this_00;
  ushort uVar7;
  Value VVar8;
  Serializer s;
  string local_80;
  ValueHolder local_60;
  ushort local_58;
  Serializer local_50;
  ValueHolder local_38;
  SField *pSStack_30;
  pointer local_28;
  pointer pSStack_20;
  undefined8 uVar6;
  
  this_00 = (STObject *)CONCAT44(in_register_00000034,options);
  if (in_ECX == 0) {
    VVar8 = getJson(this,options);
    uVar6 = VVar8._8_8_;
  }
  else {
    ppSVar1 = &(this->super_STObject).super_STBase.fName;
    *(ushort *)ppSVar1 = *(ushort *)ppSVar1 & 0xfe00;
    STObject::getSerializer(&local_50,this_00);
    first._M_current._0_4_ =
         (int)local_50.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
         (int)local_50.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    first._M_current._4_4_ = 0;
    strHex<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_80,
               (jbcoin *)
               local_50.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,first,in_ECX);
    uVar5 = (uint)(ushort)pSStack_30;
    pSStack_30._0_2_ = (short)(uVar5 & 0xfe00) + 0x104;
    Json::valueAllocator();
    local_38._0_4_ =
         (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                   (Json::valueAllocator::valueAllocator,local_80._M_dataplus._M_p,
                    (ulong)(uint)local_80._M_string_length);
    local_38._4_4_ = extraout_var;
    pVVar4 = &Json::Value::resolveReference((Value *)this,"tx",true)->value_;
    VVar2 = *pVVar4;
    *pVVar4 = local_38;
    uVar3 = *(ushort *)(pVVar4 + 1);
    pVVar4[1].bool_ = true;
    *(ushort *)(pVVar4 + 1) = uVar3 & 0xff04 | 0x104;
    uVar5 = uVar3 & 0x100 | uVar5 & 0xfe00 | (uint)(byte)uVar3;
    pSStack_30 = (SField *)CONCAT62(pSStack_30._2_6_,(short)uVar5);
    local_38 = VVar2;
    Json::Value::~Value((Value *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_38 = *(ValueHolder *)(this_00 + 1);
    pSStack_30 = this_00[1].super_STBase.fName;
    local_28 = this_00[1].v_.
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pSStack_20 = this_00[1].v_.
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    strHex<unsigned_char_const*>(&local_80,(jbcoin *)&local_38.bool_,&DAT_00000020,uVar5);
    uVar7 = local_58 & 0xfe00;
    local_58 = uVar7 + 0x104;
    Json::valueAllocator();
    local_60._0_4_ =
         (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                   (Json::valueAllocator::valueAllocator,local_80._M_dataplus._M_p,
                    (ulong)(uint)local_80._M_string_length);
    local_60._4_4_ = extraout_var_00;
    pVVar4 = &Json::Value::resolveReference((Value *)this,"hash",true)->value_;
    VVar2 = *pVVar4;
    *pVVar4 = local_60;
    uVar3 = *(ushort *)(pVVar4 + 1);
    pVVar4[1].bool_ = true;
    *(ushort *)(pVVar4 + 1) = uVar3 & 0xff04 | 0x104;
    local_58 = uVar3 & 0x100 | uVar7 | uVar3 & 0xff;
    local_60 = VVar2;
    Json::Value::~Value((Value *)&local_60);
    uVar6 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_00;
    }
    if ((jbcoin *)
        local_50.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (jbcoin *)0x0) {
      operator_delete(local_50.mData.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.mData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.mData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      uVar6 = extraout_RDX_01;
    }
  }
  VVar8._8_8_ = uVar6;
  VVar8.value_.map_ = (ObjectValues *)this;
  return VVar8;
}

Assistant:

Json::Value STTx::getJson (int options, bool binary) const
{
    if (binary)
    {
        Json::Value ret;
        Serializer s = STObject::getSerializer ();
        ret[jss::tx] = strHex (s.peekData ());
        ret[jss::hash] = to_string (getTransactionID ());
        return ret;
    }
    return getJson(options);
}